

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteSwitch<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  Vector VVar1;
  Vector VVar2;
  
  VVar1 = *left;
  VVar2 = *right;
  if (((byte)VVar1 ^ 2) == 0 && ((byte)VVar2 ^ 2) == 0) {
    ExecuteConstant<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool>
              (left,right,result,fun);
    return;
  }
  if (((byte)VVar2 ^ 2) == 0 && VVar1 == (Vector)0x0) {
    ExecuteFlat<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool,false,true>
              (left,right,result,count,fun);
    return;
  }
  if (((byte)VVar1 ^ 2) == 0 && VVar2 == (Vector)0x0) {
    ExecuteFlat<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool,true,false>
              (left,right,result,count,fun);
    return;
  }
  if (VVar2 != (Vector)0x0 || VVar1 != (Vector)0x0) {
    ExecuteGeneric<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool>
              (left,right,result,count,fun);
    return;
  }
  ExecuteFlat<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool,false,false>
            (left,right,result,count,fun);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}